

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

int getopt_internal(int nargc,char **nargv,char *options,option *long_options,int *idx,int flags)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  int local_48;
  int short_too;
  int optchar;
  char *oli;
  int flags_local;
  int *idx_local;
  option *long_options_local;
  char *options_local;
  char **nargv_local;
  int nargc_local;
  
  if (options == (char *)0x0) {
    return -1;
  }
  if (getopt_internal::posixly_correct == -1) {
    pcVar2 = getenv("POSIXLY_CORRECT");
    getopt_internal::posixly_correct = (int)(pcVar2 != (char *)0x0);
  }
  if ((getopt_internal::posixly_correct == 0) && (*options != '+')) {
    oli._4_4_ = flags;
    if (*options == '-') {
      oli._4_4_ = flags | 2;
    }
  }
  else {
    oli._4_4_ = flags & 0xfffffffe;
  }
  if ((*options == '+') || (long_options_local = (option *)options, *options == '-')) {
    long_options_local = (option *)(options + 1);
  }
  if (optind == 0) {
    optreset = 1;
    optind = 1;
  }
  optarg = (char *)0x0;
  if (optreset != 0) {
    nonopt_end = -1;
    nonopt_start = -1;
  }
  do {
    if ((optreset == 0) && (pcVar2 = place, *place != '\0')) {
LAB_00104991:
      place = pcVar2;
      if (((long_options != (option *)0x0) && (place != nargv[optind])) &&
         ((*place == '-' || ((oli._4_4_ & 4) != 0)))) {
        local_48 = 0;
        if (*place == '-') {
          place = place + 1;
        }
        else if ((*place != ':') &&
                (pcVar2 = strchr((char *)long_options_local,(int)*place), pcVar2 != (char *)0x0)) {
          local_48 = 1;
        }
        iVar1 = parse_long_options(nargv,(char *)long_options_local,long_options,idx,local_48);
        if (iVar1 != -1) {
          place = "";
          return iVar1;
        }
      }
      pcVar2 = place + 1;
      iVar1 = (int)*place;
      place = pcVar2;
      if ((iVar1 == 0x3a) ||
         (((iVar1 == 0x2d && (*pcVar2 != '\0')) ||
          (pcVar2 = strchr((char *)long_options_local,iVar1), pcVar2 == (char *)0x0)))) {
        if ((iVar1 == 0x2d) && (*place == '\0')) {
          return -1;
        }
        if (*place == '\0') {
          optind = optind + 1;
        }
        if ((opterr != 0) && (*(char *)&long_options_local->name != ':')) {
          warnx("unknown option -- %c",iVar1);
        }
        optopt = iVar1;
        return 0x3f;
      }
      if (((long_options != (option *)0x0) && (iVar1 == 0x57)) && (pcVar2[1] == ';')) {
        if (*place == '\0') {
          optind = optind + 1;
          if (nargc <= optind) {
            place = "";
            if ((opterr != 0) && (*(char *)&long_options_local->name != ':')) {
              warnx("option requires an argument -- %c",0x57);
            }
            if (*(char *)&long_options_local->name != ':') {
              optopt = iVar1;
              return 0x3f;
            }
            optopt = iVar1;
            return 0x3a;
          }
          place = nargv[optind];
        }
        iVar1 = parse_long_options(nargv,(char *)long_options_local,long_options,idx,0);
        place = "";
        return iVar1;
      }
      if (pcVar2[1] != ':') {
        if (*place != '\0') {
          return iVar1;
        }
        optind = optind + 1;
        return iVar1;
      }
      optarg = (char *)0x0;
      if (*place == '\0') {
        if (pcVar2[2] != ':') {
          optind = optind + 1;
          if (nargc <= optind) {
            place = "";
            if ((opterr != 0) && (*(char *)&long_options_local->name != ':')) {
              warnx("option requires an argument -- %c",iVar1);
            }
            if (*(char *)&long_options_local->name != ':') {
              optopt = iVar1;
              return 0x3f;
            }
            optopt = iVar1;
            return 0x3a;
          }
          optarg = nargv[optind];
        }
      }
      else {
        optarg = place;
      }
      place = "";
      optind = optind + 1;
      return iVar1;
    }
    optreset = 0;
    if (nargc <= optind) {
      place = "";
      if (nonopt_end == -1) {
        if (nonopt_start != -1) {
          optind = nonopt_start;
        }
      }
      else {
        permute_args(nonopt_start,nonopt_end,optind,nargv);
        optind = optind - (nonopt_end - nonopt_start);
      }
      nonopt_end = -1;
      nonopt_start = -1;
      return -1;
    }
    place = nargv[optind];
    if ((*place == '-') &&
       ((place[1] != '\0' ||
        (pcVar2 = strchr((char *)long_options_local,0x2d), pcVar2 != (char *)0x0)))) {
      if ((nonopt_start != -1) && (nonopt_end == -1)) {
        nonopt_end = optind;
      }
      pcVar2 = place;
      if (((place[1] != '\0') && (pcVar2 = place + 1, place[1] == '-')) && (place[2] == '\0')) {
        optind = optind + 1;
        place = "";
        if (nonopt_end != -1) {
          permute_args(nonopt_start,nonopt_end,optind,nargv);
          optind = optind - (nonopt_end - nonopt_start);
        }
        nonopt_end = -1;
        nonopt_start = -1;
        return -1;
      }
      goto LAB_00104991;
    }
    place = "";
    if ((oli._4_4_ & 2) != 0) {
      lVar3 = (long)optind;
      optind = optind + 1;
      optarg = nargv[lVar3];
      return 1;
    }
    if ((oli._4_4_ & 1) == 0) {
      return -1;
    }
    if (nonopt_start == -1) {
      nonopt_start = optind;
    }
    else if (nonopt_end != -1) {
      permute_args(nonopt_start,nonopt_end,optind,nargv);
      nonopt_start = optind - (nonopt_end - nonopt_start);
      nonopt_end = -1;
    }
    optind = optind + 1;
  } while( true );
}

Assistant:

static int
getopt_internal(int nargc, char * const * nargv, const char * options,
				const struct option * long_options, int * idx, int flags) {
	char * oli;				/* option letter list index */
	int optchar, short_too;
	static int posixly_correct = -1;

	if (options == NULL) {
		return (-1);
	}

	/*
	 * Disable GNU extensions if POSIXLY_CORRECT is set or options
	 * string begins with a '+'.
	 */
	if (posixly_correct == -1) {
		posixly_correct = (getenv("POSIXLY_CORRECT") != NULL);
	}

	if (posixly_correct || *options == '+') {
		flags &= ~FLAG_PERMUTE;
	} else if (*options == '-') {
		flags |= FLAG_ALLARGS;
	}

	if (*options == '+' || *options == '-') {
		options++;
	}

	/*
	 * XXX Some GNU programs (like cvs) set optind to 0 instead of
	 * XXX using optreset.  Work around this braindamage.
	 */
	if (optind == 0) {
		optind = optreset = 1;
	}

	optarg = NULL;

	if (optreset) {
		nonopt_start = nonopt_end = -1;
	}

start:

	if (optreset || !*place) {		/* update scanning pointer */
		optreset = 0;

		if (optind >= nargc) {          /* end of argument vector */
			place = EMSG;

			if (nonopt_end != -1) {
				/* do permutation, if we have to */
				permute_args(nonopt_start, nonopt_end,
							 optind, nargv);
				optind -= nonopt_end - nonopt_start;
			} else if (nonopt_start != -1) {
				/*
				 * If we skipped non-options, set optind
				 * to the first of them.
				 */
				optind = nonopt_start;
			}

			nonopt_start = nonopt_end = -1;
			return (-1);
		}

		if (*(place = nargv[optind]) != '-' ||
				(place[1] == '\0' && strchr(options, '-') == NULL)) {
			place = EMSG;		/* found non-option */

			if (flags & FLAG_ALLARGS) {
				/*
				 * GNU extension:
				 * return non-option as argument to option 1
				 */
				optarg = nargv[optind++];
				return (INORDER);
			}

			if (!(flags & FLAG_PERMUTE)) {
				/*
				 * If no permutation wanted, stop parsing
				 * at first non-option.
				 */
				return (-1);
			}

			/* do permutation */
			if (nonopt_start == -1) {
				nonopt_start = optind;
			} else if (nonopt_end != -1) {
				permute_args(nonopt_start, nonopt_end,
							 optind, nargv);
				nonopt_start = optind -
							   (nonopt_end - nonopt_start);
				nonopt_end = -1;
			}

			optind++;
			/* process next argument */
			goto start;
		}

		if (nonopt_start != -1 && nonopt_end == -1) {
			nonopt_end = optind;
		}

		/*
		 * If we have "-" do nothing, if "--" we are done.
		 */
		if (place[1] != '\0' && *++place == '-' && place[1] == '\0') {
			optind++;
			place = EMSG;

			/*
			 * We found an option (--), so if we skipped
			 * non-options, we have to permute.
			 */
			if (nonopt_end != -1) {
				permute_args(nonopt_start, nonopt_end,
							 optind, nargv);
				optind -= nonopt_end - nonopt_start;
			}

			nonopt_start = nonopt_end = -1;
			return (-1);
		}
	}

	/*
	 * Check long options if:
	 *  1) we were passed some
	 *  2) the arg is not just "-"
	 *  3) either the arg starts with -- we are getopt_long_only()
	 */
	if (long_options != NULL && place != nargv[optind] &&
			(*place == '-' || (flags & FLAG_LONGONLY))) {
		short_too = 0;

		if (*place == '-') {
			place++;    /* --foo long option */
		} else if (*place != ':' && strchr(options, *place) != NULL) {
			short_too = 1;    /* could be short option too */
		}

		optchar = parse_long_options(nargv, options, long_options,
									 idx, short_too);

		if (optchar != -1) {
			place = EMSG;
			return (optchar);
		}
	}

	if ((optchar = (int) * place++) == (int)':' ||
			(optchar == (int)'-' && *place != '\0') ||
			(oli = strchr(options, optchar)) == NULL) {
		/*
		 * If the user specified "-" and  '-' isn't listed in
		 * options, return -1 (non-option) as per POSIX.
		 * Otherwise, it is an unknown option character (or ':').
		 */
		if (optchar == (int)'-' && *place == '\0') {
			return (-1);
		}

		if (!*place) {
			++optind;
		}

		if (PRINT_ERROR) {
			warnx(illoptchar, optchar);
		}

		optopt = optchar;
		return (BADCH);
	}

	if (long_options != NULL && optchar == 'W' && oli[1] == ';') {
		/* -W long-option */
		if (*place)			/* no space */
			/* NOTHING */;
		else if (++optind >= nargc) {	/* no arg */
			place = EMSG;

			if (PRINT_ERROR) {
				warnx(recargchar, optchar);
			}

			optopt = optchar;
			return (BADARG);
		} else {			/* white space */
			place = nargv[optind];
		}

		optchar = parse_long_options(nargv, options, long_options,
									 idx, 0);
		place = EMSG;
		return (optchar);
	}

	if (*++oli != ':') {			/* doesn't take argument */
		if (!*place) {
			++optind;
		}
	} else {				/* takes (optional) argument */
		optarg = NULL;

		if (*place) {		/* no white space */
			optarg = place;
		} else if (oli[1] != ':') {	/* arg not optional */
			if (++optind >= nargc) {	/* no arg */
				place = EMSG;

				if (PRINT_ERROR) {
					warnx(recargchar, optchar);
				}

				optopt = optchar;
				return (BADARG);
			} else {
				optarg = nargv[optind];
			}
		}

		place = EMSG;
		++optind;
	}

	/* dump back option letter */
	return (optchar);
}